

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int calc_active_worst_quality_no_stats_vbr(AV1_COMP *cpi)

{
  uint uVar1;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int last_q_inter_frame;
  int last_q_key_frame;
  int active_worst_quality;
  uint curr_frame;
  RefreshFrameInfo *refresh_frame;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1_COMP *cpi_local;
  
  uVar1 = (cpi->common).current_frame.frame_number;
  local_34 = (cpi->ppi->p_rc).last_q[0];
  local_38 = (cpi->ppi->p_rc).last_q[1];
  if ((cpi->common).current_frame.frame_type == '\0') {
    if (uVar1 == 0) {
      local_34 = (cpi->rc).worst_quality;
    }
    else {
      local_34 = local_34 << 1;
    }
    active_worst_quality = local_34;
  }
  else if (((cpi->rc).is_src_frame_alt_ref == 0) &&
          (((((cpi->refresh_frame).golden_frame & 1U) != 0 ||
            (((cpi->refresh_frame).bwd_ref_frame & 1U) != 0)) ||
           (((cpi->refresh_frame).alt_ref_frame & 1U) != 0)))) {
    if (uVar1 == 1) {
      local_38 = (local_34 * 5) / 4;
    }
    active_worst_quality = local_38;
  }
  else {
    if (uVar1 == 1) {
      local_38 = local_34;
    }
    local_3c = local_38 << 1;
    active_worst_quality = local_3c;
  }
  if (active_worst_quality < (cpi->rc).worst_quality) {
    local_40 = active_worst_quality;
  }
  else {
    local_40 = (cpi->rc).worst_quality;
  }
  return local_40;
}

Assistant:

static int calc_active_worst_quality_no_stats_vbr(const AV1_COMP *cpi) {
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;
  const unsigned int curr_frame = cpi->common.current_frame.frame_number;
  int active_worst_quality;
  int last_q_key_frame;
  int last_q_inter_frame;
#if CONFIG_FPMT_TEST
  const int simulate_parallel_frame =
      cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0 &&
      cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE;
  last_q_key_frame = simulate_parallel_frame ? p_rc->temp_last_q[KEY_FRAME]
                                             : p_rc->last_q[KEY_FRAME];
  last_q_inter_frame = simulate_parallel_frame ? p_rc->temp_last_q[INTER_FRAME]
                                               : p_rc->last_q[INTER_FRAME];
#else
  last_q_key_frame = p_rc->last_q[KEY_FRAME];
  last_q_inter_frame = p_rc->last_q[INTER_FRAME];
#endif

  if (cpi->common.current_frame.frame_type == KEY_FRAME) {
    active_worst_quality =
        curr_frame == 0 ? rc->worst_quality : last_q_key_frame * 2;
  } else {
    if (!rc->is_src_frame_alt_ref &&
        (refresh_frame->golden_frame || refresh_frame->bwd_ref_frame ||
         refresh_frame->alt_ref_frame)) {
      active_worst_quality =
          curr_frame == 1 ? last_q_key_frame * 5 / 4 : last_q_inter_frame;
    } else {
      active_worst_quality =
          curr_frame == 1 ? last_q_key_frame * 2 : last_q_inter_frame * 2;
    }
  }
  return AOMMIN(active_worst_quality, rc->worst_quality);
}